

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_base.h
# Opt level: O3

void mp::
     WriteModelItem<fmt::BasicMemoryWriter<char,std::allocator<char>>,std::vector<int,std::allocator<int>>,int>
               (BasicMemoryWriter<char,_std::allocator<char>_> *wrt,
               vector<int,_std::allocator<int>_> *v,ItemNamer *vnam)

{
  Buffer<char> *pBVar1;
  int *piVar2;
  size_t sVar3;
  char *pcVar4;
  size_t __n;
  int *el;
  int *piVar5;
  ptrdiff_t _Num;
  ulong uVar6;
  int iVar7;
  char *str;
  bool bVar8;
  
  pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
  sVar3 = pBVar1->size_;
  if (sVar3 == pBVar1->capacity_) {
    (**pBVar1->_vptr_Buffer)(pBVar1,sVar3 + 1);
    sVar3 = pBVar1->size_;
  }
  pBVar1->size_ = sVar3 + 1;
  pBVar1->ptr_[sVar3] = '[';
  piVar5 = (v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar2 = (v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (piVar5 != piVar2) {
    iVar7 = 0;
    do {
      bVar8 = iVar7 != 0;
      iVar7 = iVar7 + -1;
      if (bVar8) {
        pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
        sVar3 = pBVar1->size_;
        uVar6 = sVar3 + 2;
        if (pBVar1->capacity_ < uVar6) {
          (**pBVar1->_vptr_Buffer)(pBVar1,uVar6);
          sVar3 = pBVar1->size_;
        }
        pcVar4 = pBVar1->ptr_;
        (pcVar4 + sVar3)[0] = ',';
        (pcVar4 + sVar3)[1] = ' ';
        pBVar1->size_ = uVar6;
      }
      pcVar4 = ItemNamer::at(vnam,(long)*piVar5);
      __n = strlen(pcVar4);
      pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
      uVar6 = pBVar1->size_ + __n;
      if (pBVar1->capacity_ < uVar6) {
        (**pBVar1->_vptr_Buffer)(pBVar1,uVar6);
      }
      if (__n != 0) {
        memmove(pBVar1->ptr_ + pBVar1->size_,pcVar4,__n);
      }
      pBVar1->size_ = uVar6;
      piVar5 = piVar5 + 1;
    } while (piVar5 != piVar2);
  }
  pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
  sVar3 = pBVar1->size_;
  if (sVar3 == pBVar1->capacity_) {
    (**pBVar1->_vptr_Buffer)(pBVar1,sVar3 + 1);
    sVar3 = pBVar1->size_;
  }
  pBVar1->size_ = sVar3 + 1;
  pBVar1->ptr_[sVar3] = ']';
  return;
}

Assistant:

inline void WriteModelItem(
    Writer& wrt, const Vec& v,
    ItemNamer& vnam) {
  static_assert (
  std::is_integral_v<typename Vec::value_type>, "Variable vector: need int's");
  wrt << '[';
  int n=-1;
  for (const auto& el: v) {
    if (++n)
      wrt << ", ";
    wrt << vnam.at(el);
  }
  wrt << ']';
}